

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O0

void duckdb::MinMaxNOperation::
     Combine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxStringValue,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
               (ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,_duckdb::MinMaxStringValue,_duckdb::GreaterThan>
                *source,ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,_duckdb::MinMaxStringValue,_duckdb::GreaterThan>
                        *target,AggregateInputData *aggr_input)

{
  idx_t iVar1;
  idx_t iVar2;
  string *msg;
  long in_RDX;
  ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,_duckdb::MinMaxStringValue,_duckdb::GreaterThan>
  *in_RSI;
  BinaryAggregateHeap<duckdb::string_t,_float,_duckdb::GreaterThan> *in_RDI;
  idx_t in_stack_ffffffffffffff90;
  allocator *this;
  ArenaAllocator *in_stack_ffffffffffffff98;
  ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,_duckdb::MinMaxStringValue,_duckdb::GreaterThan>
  *in_stack_ffffffffffffffa0;
  ArenaAllocator *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  allocator local_39;
  string local_38 [40];
  ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,_duckdb::MinMaxStringValue,_duckdb::GreaterThan>
  *local_10;
  
  if ((in_RDI[1].capacity & 1) != 0) {
    if ((in_RSI->is_initialized & 1U) == 0) {
      in_stack_ffffffffffffffa8 = *(ArenaAllocator **)(in_RDX + 8);
      BinaryAggregateHeap<duckdb::string_t,_float,_duckdb::GreaterThan>::Capacity(in_RDI);
      ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,_duckdb::MinMaxStringValue,_duckdb::GreaterThan>
      ::Initialize(in_RSI,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      in_stack_ffffffffffffffa0 = in_RSI;
    }
    else {
      local_10 = in_RSI;
      iVar1 = BinaryAggregateHeap<duckdb::string_t,_float,_duckdb::GreaterThan>::Capacity(in_RDI);
      iVar2 = BinaryAggregateHeap<duckdb::string_t,_float,_duckdb::GreaterThan>::Capacity
                        (&local_10->heap);
      if (iVar1 != iVar2) {
        msg = (string *)__cxa_allocate_exception(0x10);
        this = &local_39;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_38,"Mismatched n values in min/max/arg_min/arg_max",this);
        InvalidInputException::InvalidInputException((InvalidInputException *)this,msg);
        __cxa_throw(msg,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
    }
    BinaryAggregateHeap<duckdb::string_t,_float,_duckdb::GreaterThan>::Insert
              ((BinaryAggregateHeap<duckdb::string_t,_float,_duckdb::GreaterThan> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8,&in_stack_ffffffffffffffa0->heap);
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &aggr_input) {
		if (!source.is_initialized) {
			// source is empty, nothing to do
			return;
		}

		if (!target.is_initialized) {
			target.Initialize(aggr_input.allocator, source.heap.Capacity());
		} else if (source.heap.Capacity() != target.heap.Capacity()) {
			throw InvalidInputException("Mismatched n values in min/max/arg_min/arg_max");
		}

		// Merge the heaps
		target.heap.Insert(aggr_input.allocator, source.heap);
	}